

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  ImDrawCmd *pIVar8;
  ImVector<ImDrawCmd> *in_RDI;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  
  pIVar8 = in_RDI->Data + (in_RDI->Size + -1);
  if (pIVar8->ElemCount != 0) {
    cVar9 = -(*(char *)&(pIVar8->ClipRect).x == *(char *)&in_RDI[8].Data);
    cVar10 = -(*(char *)((long)&(pIVar8->ClipRect).x + 1) == *(char *)((long)&in_RDI[8].Data + 1));
    cVar11 = -(*(char *)((long)&(pIVar8->ClipRect).x + 2) == *(char *)((long)&in_RDI[8].Data + 2));
    cVar12 = -(*(char *)((long)&(pIVar8->ClipRect).x + 3) == *(char *)((long)&in_RDI[8].Data + 3));
    cVar13 = -(*(char *)&(pIVar8->ClipRect).y == *(char *)((long)&in_RDI[8].Data + 4));
    cVar14 = -(*(char *)((long)&(pIVar8->ClipRect).y + 1) == *(char *)((long)&in_RDI[8].Data + 5));
    cVar15 = -(*(char *)((long)&(pIVar8->ClipRect).y + 2) == *(char *)((long)&in_RDI[8].Data + 6));
    cVar16 = -(*(char *)((long)&(pIVar8->ClipRect).y + 3) == *(char *)((long)&in_RDI[8].Data + 7));
    cVar17 = -(*(char *)&(pIVar8->ClipRect).z == (char)in_RDI[9].Size);
    cVar18 = -(*(char *)((long)&(pIVar8->ClipRect).z + 1) == *(char *)((long)&in_RDI[9].Size + 1));
    cVar19 = -(*(char *)((long)&(pIVar8->ClipRect).z + 2) == *(char *)((long)&in_RDI[9].Size + 2));
    cVar20 = -(*(char *)((long)&(pIVar8->ClipRect).z + 3) == *(char *)((long)&in_RDI[9].Size + 3));
    cVar21 = -(*(char *)&(pIVar8->ClipRect).w == (char)in_RDI[9].Capacity);
    cVar22 = -(*(char *)((long)&(pIVar8->ClipRect).w + 1) ==
              *(char *)((long)&in_RDI[9].Capacity + 1));
    cVar23 = -(*(char *)((long)&(pIVar8->ClipRect).w + 2) ==
              *(char *)((long)&in_RDI[9].Capacity + 2));
    bVar24 = -(*(char *)((long)&(pIVar8->ClipRect).w + 3) ==
              *(char *)((long)&in_RDI[9].Capacity + 3));
    auVar1[1] = cVar10;
    auVar1[0] = cVar9;
    auVar1[2] = cVar11;
    auVar1[3] = cVar12;
    auVar1[4] = cVar13;
    auVar1[5] = cVar14;
    auVar1[6] = cVar15;
    auVar1[7] = cVar16;
    auVar1[8] = cVar17;
    auVar1[9] = cVar18;
    auVar1[10] = cVar19;
    auVar1[0xb] = cVar20;
    auVar1[0xc] = cVar21;
    auVar1[0xd] = cVar22;
    auVar1[0xe] = cVar23;
    auVar1[0xf] = bVar24;
    auVar2[1] = cVar10;
    auVar2[0] = cVar9;
    auVar2[2] = cVar11;
    auVar2[3] = cVar12;
    auVar2[4] = cVar13;
    auVar2[5] = cVar14;
    auVar2[6] = cVar15;
    auVar2[7] = cVar16;
    auVar2[8] = cVar17;
    auVar2[9] = cVar18;
    auVar2[10] = cVar19;
    auVar2[0xb] = cVar20;
    auVar2[0xc] = cVar21;
    auVar2[0xd] = cVar22;
    auVar2[0xe] = cVar23;
    auVar2[0xf] = bVar24;
    auVar6[1] = cVar12;
    auVar6[0] = cVar11;
    auVar6[2] = cVar13;
    auVar6[3] = cVar14;
    auVar6[4] = cVar15;
    auVar6[5] = cVar16;
    auVar6[6] = cVar17;
    auVar6[7] = cVar18;
    auVar6[8] = cVar19;
    auVar6[9] = cVar20;
    auVar6[10] = cVar21;
    auVar6[0xb] = cVar22;
    auVar6[0xc] = cVar23;
    auVar6[0xd] = bVar24;
    auVar5[1] = cVar13;
    auVar5[0] = cVar12;
    auVar5[2] = cVar14;
    auVar5[3] = cVar15;
    auVar5[4] = cVar16;
    auVar5[5] = cVar17;
    auVar5[6] = cVar18;
    auVar5[7] = cVar19;
    auVar5[8] = cVar20;
    auVar5[9] = cVar21;
    auVar5[10] = cVar22;
    auVar5[0xb] = cVar23;
    auVar5[0xc] = bVar24;
    auVar4[1] = cVar14;
    auVar4[0] = cVar13;
    auVar4[2] = cVar15;
    auVar4[3] = cVar16;
    auVar4[4] = cVar17;
    auVar4[5] = cVar18;
    auVar4[6] = cVar19;
    auVar4[7] = cVar20;
    auVar4[8] = cVar21;
    auVar4[9] = cVar22;
    auVar4[10] = cVar23;
    auVar4[0xb] = bVar24;
    auVar3[1] = cVar15;
    auVar3[0] = cVar14;
    auVar3[2] = cVar16;
    auVar3[3] = cVar17;
    auVar3[4] = cVar18;
    auVar3[5] = cVar19;
    auVar3[6] = cVar20;
    auVar3[7] = cVar21;
    auVar3[8] = cVar22;
    auVar3[9] = cVar23;
    auVar3[10] = bVar24;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar24 >> 7) << 0xf) != 0xffff) {
      AddDrawCmd((ImDrawList *)prev_cmd);
      return;
    }
  }
  if ((((pIVar8->ElemCount == 0) && (1 < in_RDI->Size)) &&
      (iVar7 = memcmp(&in_RDI[8].Data,pIVar8 + -1,0x1c), iVar7 == 0)) &&
     (pIVar8[-1].UserCallback == (ImDrawCallback)0x0)) {
    ImVector<ImDrawCmd>::pop_back(in_RDI);
    return;
  }
  *(ImDrawCmd **)&pIVar8->ClipRect = in_RDI[8].Data;
  iVar7 = in_RDI[9].Capacity;
  (pIVar8->ClipRect).z = (float)in_RDI[9].Size;
  (pIVar8->ClipRect).w = (float)iVar7;
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}